

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O0

void wasm::debug::copyDebugInfo
               (Expression *origin,Expression *copy,Function *originFunc,Function *copyFunc)

{
  BinaryLocation BVar1;
  BinaryLocation BVar2;
  bool bVar3;
  unordered_map<wasm::Expression_*,_wasm::Function::DebugLocation,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>_>_>
  *this;
  size_type sVar4;
  size_type sVar5;
  ulong uVar6;
  reference ppEVar7;
  pointer ppVar8;
  mapped_type *pmVar9;
  DebugLocation location;
  _Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>,_false>
  local_238;
  iterator iter;
  Index i;
  unordered_map<wasm::Expression_*,_wasm::Function::DebugLocation,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>_>_>
  *copyDebug;
  unordered_map<wasm::Expression_*,_wasm::Function::DebugLocation,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>_>_>
  *originDebug;
  Lister copyList;
  undefined1 local_118 [8];
  Lister originList;
  Function *copyFunc_local;
  Function *originFunc_local;
  Expression *copy_local;
  Expression *origin_local;
  
  originList.list.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)copyFunc;
  originFunc_local = (Function *)copy;
  copy_local = origin;
  copyDebugInfo::Lister::Lister((Lister *)local_118);
  Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>::walk
            ((Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_> *)local_118,&copy_local)
  ;
  copyDebugInfo::Lister::Lister((Lister *)&originDebug);
  Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>::walk
            ((Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_> *)&originDebug,
             (Expression **)&originFunc_local);
  this = (unordered_map<wasm::Expression_*,_wasm::Function::DebugLocation,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>_>_>
          *)(originList.list.
             super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage + 0x1c);
  sVar4 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::size
                    ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                     &originList.
                      super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
                      super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.currModule
                    );
  sVar5 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::size
                    ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                     &copyList.
                      super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
                      super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.currModule
                    );
  if (sVar4 != sVar5) {
    __assert_fail("originList.list.size() == copyList.list.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/debug.h"
                  ,0x2b,
                  "void wasm::debug::copyDebugInfo(Expression *, Expression *, Function *, Function *)"
                 );
  }
  for (iter.
       super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>,_false>
       ._M_cur._4_4_ = 0;
      uVar6 = (ulong)iter.
                     super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>,_false>
                     ._M_cur._4_4_,
      sVar4 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::size
                        ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                         &originList.
                          super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
                          super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
                          currModule), uVar6 < sVar4;
      iter.
      super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>,_false>
      ._M_cur._4_4_ =
           iter.
           super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>,_false>
           ._M_cur._4_4_ + 1) {
    ppEVar7 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::operator[]
                        ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                         &originList.
                          super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
                          super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
                          currModule,
                         (ulong)iter.
                                super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>,_false>
                                ._M_cur._4_4_);
    local_238._M_cur =
         (__node_type *)
         std::
         unordered_map<wasm::Expression_*,_wasm::Function::DebugLocation,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>_>_>
         ::find(&originFunc->debugLocations,ppEVar7);
    register0x00000000 =
         (__node_type *)
         std::
         unordered_map<wasm::Expression_*,_wasm::Function::DebugLocation,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>_>_>
         ::end(&originFunc->debugLocations);
    bVar3 = std::__detail::operator!=
                      (&local_238,
                       (_Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>,_false>
                        *)&location.columnNumber);
    if (bVar3) {
      ppVar8 = std::__detail::
               _Node_iterator<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>,_false,_false>
               ::operator->((_Node_iterator<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>,_false,_false>
                             *)&local_238);
      location.fileIndex = (ppVar8->second).columnNumber;
      BVar1 = (ppVar8->second).fileIndex;
      BVar2 = (ppVar8->second).lineNumber;
      ppEVar7 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::operator[]
                          ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                           &copyList.
                            super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
                            super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
                            currModule,
                           (ulong)iter.
                                  super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>,_false>
                                  ._M_cur._4_4_);
      pmVar9 = std::
               unordered_map<wasm::Expression_*,_wasm::Function::DebugLocation,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>_>_>
               ::operator[](this,ppEVar7);
      pmVar9->fileIndex = BVar1;
      pmVar9->lineNumber = BVar2;
      pmVar9->columnNumber = location.fileIndex;
    }
  }
  copyDebugInfo::Lister::~Lister((Lister *)&originDebug);
  copyDebugInfo::Lister::~Lister((Lister *)local_118);
  return;
}

Assistant:

inline void copyDebugInfo(Expression* origin,
                          Expression* copy,
                          Function* originFunc,
                          Function* copyFunc) {
  struct Lister : public PostWalker<Lister, UnifiedExpressionVisitor<Lister>> {
    std::vector<Expression*> list;
    void visitExpression(Expression* curr) { list.push_back(curr); }
  };

  Lister originList;
  originList.walk(origin);
  Lister copyList;
  copyList.walk(copy);

  auto& originDebug = originFunc->debugLocations;
  auto& copyDebug = copyFunc->debugLocations;

  assert(originList.list.size() == copyList.list.size());
  for (Index i = 0; i < originList.list.size(); i++) {
    auto iter = originDebug.find(originList.list[i]);
    if (iter != originDebug.end()) {
      auto location = iter->second;
      copyDebug[copyList.list[i]] = location;
    }
  }
}